

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O0

SRes SzDecodePpmd(Byte *props,uint propsSize,UInt64 inSize,ILookInStream *inStream,Byte *outBuffer,
                 SizeT outSize,ISzAlloc *allocMain)

{
  Bool_conflict BVar1;
  int iVar2;
  long in_RDX;
  int in_ESI;
  byte *in_RDI;
  long in_R8;
  ulong in_R9;
  int sym;
  SizeT i;
  CPpmd7z_RangeDec rc;
  UInt32 memSize;
  uint order;
  SRes res;
  CByteInToLook s;
  CPpmd7 ppmd;
  undefined4 in_stack_ffffffffffffb448;
  uint in_stack_ffffffffffffb44c;
  undefined4 in_stack_ffffffffffffb450;
  UInt32 in_stack_ffffffffffffb454;
  undefined4 in_stack_ffffffffffffb458;
  undefined4 in_stack_ffffffffffffb45c;
  CPpmd7 *in_stack_ffffffffffffb460;
  ulong uVar3;
  CPpmd7z_RangeDec local_4b98;
  uint local_4b6c;
  uint local_4b68;
  UInt32 local_4b64;
  IByteIn local_4b60;
  long local_4b58;
  undefined8 local_4b50;
  long local_4b48;
  long local_4b40;
  int local_4b38;
  UInt32 local_4b34;
  IPpmd7_RangeDec *in_stack_ffffffffffffbdb0;
  CPpmd7 *in_stack_ffffffffffffbdb8;
  UInt32 local_4;
  
  local_4b64 = 0;
  local_4b60.Read = ReadByte;
  local_4b58 = 0;
  local_4b50 = 0;
  local_4b48 = 0;
  local_4b38 = 0;
  local_4b34 = 0;
  local_4b40 = 0;
  if (in_ESI == 5) {
    local_4b68 = (uint)*in_RDI;
    local_4b6c = *(uint *)(in_RDI + 1);
    if ((((local_4b68 < 2) || (0x40 < local_4b68)) || (local_4b6c < 0x800)) ||
       (0xffffffdb < local_4b6c)) {
      local_4 = 4;
    }
    else {
      Ppmd7_Construct(in_stack_ffffffffffffb460);
      BVar1 = Ppmd7_Alloc((CPpmd7 *)CONCAT44(in_stack_ffffffffffffb45c,in_stack_ffffffffffffb458),
                          in_stack_ffffffffffffb454,
                          (ISzAlloc *)CONCAT44(in_stack_ffffffffffffb44c,in_stack_ffffffffffffb448))
      ;
      if (BVar1 == 0) {
        local_4 = 2;
      }
      else {
        Ppmd7_Init((CPpmd7 *)CONCAT44(in_stack_ffffffffffffb454,in_stack_ffffffffffffb450),
                   in_stack_ffffffffffffb44c);
        Ppmd7z_RangeDec_CreateVTable(&local_4b98);
        local_4b98.Stream = &local_4b60;
        BVar1 = Ppmd7z_RangeDec_Init
                          ((CPpmd7z_RangeDec *)
                           CONCAT44(in_stack_ffffffffffffb44c,in_stack_ffffffffffffb448));
        if (BVar1 == 0) {
          local_4b64 = 1;
        }
        else if (local_4b38 == 0) {
          uVar3 = 0;
          while (((uVar3 < in_R9 &&
                  (iVar2 = Ppmd7_DecodeSymbol(in_stack_ffffffffffffbdb8,in_stack_ffffffffffffbdb0),
                  local_4b38 == 0)) && (-1 < iVar2))) {
            *(char *)(in_R8 + uVar3) = (char)iVar2;
            uVar3 = uVar3 + 1;
          }
          if (uVar3 == in_R9) {
            if ((local_4b40 + (local_4b58 - local_4b48) != in_RDX) || (local_4b98.Code != 0)) {
              local_4b64 = 1;
            }
          }
          else {
            in_stack_ffffffffffffb454 = local_4b34;
            local_4b64 = local_4b34;
            if (local_4b34 == 0) {
              in_stack_ffffffffffffb454 = 1;
              local_4b64 = in_stack_ffffffffffffb454;
            }
          }
        }
        else {
          local_4b64 = local_4b34;
          if (local_4b34 == 0) {
            local_4b64 = 1;
          }
        }
        Ppmd7_Free((CPpmd7 *)CONCAT44(in_stack_ffffffffffffb454,in_stack_ffffffffffffb450),
                   (ISzAlloc *)CONCAT44(in_stack_ffffffffffffb44c,in_stack_ffffffffffffb448));
        local_4 = local_4b64;
      }
    }
  }
  else {
    local_4 = 4;
  }
  return local_4;
}

Assistant:

static SRes SzDecodePpmd(const Byte *props, unsigned propsSize, UInt64 inSize, ILookInStream *inStream,
    Byte *outBuffer, SizeT outSize, ISzAlloc *allocMain)
{
  CPpmd7 ppmd;
  CByteInToLook s;
  SRes res = SZ_OK;

  s.p.Read = ReadByte;
  s.inStream = inStream;
  s.begin = s.end = s.cur = NULL;
  s.extra = False;
  s.res = SZ_OK;
  s.processed = 0;

  if (propsSize != 5)
    return SZ_ERROR_UNSUPPORTED;

  {
    unsigned order = props[0];
    UInt32 memSize = GetUi32(props + 1);
    if (order < PPMD7_MIN_ORDER ||
        order > PPMD7_MAX_ORDER ||
        memSize < PPMD7_MIN_MEM_SIZE ||
        memSize > PPMD7_MAX_MEM_SIZE)
      return SZ_ERROR_UNSUPPORTED;
    Ppmd7_Construct(&ppmd);
    if (!Ppmd7_Alloc(&ppmd, memSize, allocMain))
      return SZ_ERROR_MEM;
    Ppmd7_Init(&ppmd, order);
  }
  {
    CPpmd7z_RangeDec rc;
    Ppmd7z_RangeDec_CreateVTable(&rc);
    rc.Stream = &s.p;
    if (!Ppmd7z_RangeDec_Init(&rc))
      res = SZ_ERROR_DATA;
    else if (s.extra)
      res = (s.res != SZ_OK ? s.res : SZ_ERROR_DATA);
    else
    {
      SizeT i;
      for (i = 0; i < outSize; i++)
      {
        int sym = Ppmd7_DecodeSymbol(&ppmd, &rc.p);
        if (s.extra || sym < 0)
          break;
        outBuffer[i] = (Byte)sym;
      }
      if (i != outSize)
        res = (s.res != SZ_OK ? s.res : SZ_ERROR_DATA);
      else if (s.processed + (s.cur - s.begin) != inSize || !Ppmd7z_RangeDec_IsFinishedOK(&rc))
        res = SZ_ERROR_DATA;
    }
  }
  Ppmd7_Free(&ppmd, allocMain);
  return res;
}